

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

string * __thiscall Graph::to_string_abi_cxx11_(string *__return_storage_ptr__,Graph *this)

{
  bool bVar1;
  pointer this_00;
  pointer this_01;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  __normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_> local_90;
  __normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_> local_88;
  iterator connection;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  __normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_> local_40;
  __normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_> local_38;
  iterator node;
  allocator<char> local_1a;
  undefined1 local_19;
  Graph *local_18;
  Graph *this_local;
  string *str;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Graph *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"digraph G { \n",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  local_38._M_current = (Node *)std::vector<Node,_std::allocator<Node>_>::begin(&this->nodes);
  while( true ) {
    local_40._M_current = (Node *)std::vector<Node,_std::allocator<Node>_>::end(&this->nodes);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    this_00 = __gnu_cxx::__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>::
              operator->(&local_38);
    Node::to_string_abi_cxx11_((string *)&connection,this_00);
    std::operator+(&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&connection,
                   "\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&connection);
    __gnu_cxx::__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>::operator++
              (&local_38);
  }
  local_88._M_current =
       (Connection *)std::vector<Connection,_std::allocator<Connection>_>::begin(&this->connections)
  ;
  while( true ) {
    local_90._M_current =
         (Connection *)std::vector<Connection,_std::allocator<Connection>_>::end(&this->connections)
    ;
    bVar1 = __gnu_cxx::operator!=(&local_88,&local_90);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>
              ::operator->(&local_88);
    Connection::to_string_abi_cxx11_(&local_d0,this_01);
    std::operator+(&local_b0,&local_d0,"\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    __gnu_cxx::
    __normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>::
    operator++(&local_88);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::__cxx11::string::operator=((string *)&this->rankdir,"LR");
  }
  std::operator+(&local_110,"rankdir=",&this->rankdir);
  std::operator+(&local_f0,&local_110,"\n}");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  return __return_storage_ptr__;
}

Assistant:

string Graph::to_string() {
    string str = "digraph G { \n";
    for (vector<Node>::iterator node = nodes.begin(); node != nodes.end(); ++node) {
        str += node->to_string() + "\n";
    }
    for (vector<Connection>::iterator connection = connections.begin(); connection != connections.end(); ++connection) {
        str += connection->to_string() + "\n";
    }
    if (rankdir.empty()) {
        rankdir = "LR";
    }
    str += "rankdir=" + rankdir + "\n}";
    return str;
}